

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O2

CURLcode Curl_sasl_start(SASL *sasl,connectdata *conn,_Bool force_ir,saslprogress *progress)

{
  SessionHandle *data;
  ulong uVar1;
  CURLcode CVar2;
  size_t sVar3;
  uint uVar4;
  char *__s;
  char *pcVar5;
  saslstate local_48;
  saslstate local_44;
  char *resp;
  size_t len;
  
  data = conn->data;
  resp = (char *)0x0;
  len = 0;
  sasl->force_ir = force_ir;
  sasl->authused = 0;
  uVar4 = sasl->prefmech & sasl->authmechs;
  *progress = SASL_IDLE;
  if (((uVar4 & 0x20) != 0) && (*conn->passwd == '\0')) {
    sasl->authused = 0x20;
    if ((force_ir) || ((data->set).sasl_ir == true)) {
      CVar2 = sasl_create_login_message(data,conn->user,&resp,&len);
      local_44 = SASL_FINAL;
      local_48 = SASL_EXTERNAL;
      __s = "EXTERNAL";
      goto LAB_0045ee70;
    }
    local_44 = SASL_FINAL;
    local_48 = SASL_EXTERNAL;
    __s = "EXTERNAL";
    goto LAB_0045eed6;
  }
  if ((conn->bits).user_passwd == true) {
    if ((uVar4 & 8) == 0) {
      if ((uVar4 & 4) != 0) {
        sasl->authused = 4;
        __s = "CRAM-MD5";
        local_48 = SASL_CRAMMD5;
        goto LAB_0045eecf;
      }
      if (((char)uVar4 < '\0') || (conn->xoauth2_bearer != (char *)0x0)) {
        sasl->authused = 0x80;
        if ((!force_ir) && ((data->set).sasl_ir != true)) {
          local_48 = SASL_XOAUTH2;
          __s = "XOAUTH2";
          goto LAB_0045eecf;
        }
        CVar2 = sasl_create_xoauth2_message(data,conn->user,conn->xoauth2_bearer,&resp,&len);
        local_44 = SASL_FINAL;
        local_48 = SASL_XOAUTH2;
        __s = "XOAUTH2";
      }
      else if ((uVar4 & 1) == 0) {
        if ((uVar4 & 2) == 0) goto LAB_0045ef3e;
        sasl->authused = 2;
        if ((!force_ir) && ((data->set).sasl_ir != true)) {
          local_48 = SASL_PLAIN;
          __s = "PLAIN";
          goto LAB_0045eecf;
        }
        CVar2 = sasl_create_plain_message(data,conn->user,conn->passwd,&resp,&len);
        local_44 = SASL_FINAL;
        local_48 = SASL_PLAIN;
        __s = "PLAIN";
      }
      else {
        sasl->authused = 1;
        if ((!force_ir) && ((data->set).sasl_ir != true)) {
          local_44 = SASL_LOGIN_PASSWD;
          local_48 = SASL_LOGIN;
          __s = "LOGIN";
          goto LAB_0045eed6;
        }
        CVar2 = sasl_create_login_message(data,conn->user,&resp,&len);
        local_44 = SASL_LOGIN_PASSWD;
        local_48 = SASL_LOGIN;
        __s = "LOGIN";
      }
LAB_0045ee70:
      pcVar5 = resp;
      if (CVar2 != CURLE_OK) goto LAB_0045ef40;
      if (resp == (char *)0x0) goto LAB_0045eed6;
      uVar1 = sasl->params->maxirlen;
      if ((uVar1 != 0) && (sVar3 = strlen(__s), uVar1 < sVar3 + len)) {
        (*Curl_cfree)(pcVar5);
        resp = (char *)0x0;
        goto LAB_0045eed6;
      }
    }
    else {
      sasl->authused = 8;
      __s = "DIGEST-MD5";
      local_48 = SASL_DIGESTMD5;
LAB_0045eecf:
      local_44 = SASL_FINAL;
LAB_0045eed6:
      pcVar5 = (char *)0x0;
    }
    CVar2 = (*sasl->params->sendauth)(conn,__s,pcVar5);
    if (CVar2 != CURLE_OK) goto LAB_0045ef40;
    *progress = SASL_INPROGRESS;
    if (resp == (char *)0x0) {
      local_44 = local_48;
    }
    sasl->state = local_44;
  }
LAB_0045ef3e:
  CVar2 = CURLE_OK;
LAB_0045ef40:
  (*Curl_cfree)(resp);
  return CVar2;
}

Assistant:

CURLcode Curl_sasl_start(struct SASL *sasl, struct connectdata *conn,
                         bool force_ir, saslprogress *progress)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  unsigned int enabledmechs;
  const char *mech = NULL;
  char *resp = NULL;
  size_t len = 0;
  saslstate state1 = SASL_STOP;
  saslstate state2 = SASL_FINAL;

  sasl->force_ir = force_ir;    /* Latch for future use */
  sasl->authused = 0;           /* No mechanism used yet */
  enabledmechs = sasl->authmechs & sasl->prefmech;
  *progress = SASL_IDLE;

  /* Calculate the supported authentication mechanism, by decreasing order of
     security, as well as the initial response where appropriate */
  if((enabledmechs & SASL_MECH_EXTERNAL) && !conn->passwd[0]) {
    mech = SASL_MECH_STRING_EXTERNAL;
    state1 = SASL_EXTERNAL;
    sasl->authused = SASL_MECH_EXTERNAL;

    if(force_ir || data->set.sasl_ir)
      result = sasl_create_external_message(data, conn->user, &resp, &len);
  }
  else if(conn->bits.user_passwd) {
#if defined(USE_KERBEROS5)
    if(enabledmechs & SASL_MECH_GSSAPI) {
      sasl->mutual_auth = FALSE; /* TODO: Calculate mutual authentication */
      mech = SASL_MECH_STRING_GSSAPI;
      state1 = SASL_GSSAPI;
      state2 = SASL_GSSAPI_TOKEN;
      sasl->authused = SASL_MECH_GSSAPI;

      if(force_ir || data->set.sasl_ir)
        result = Curl_sasl_create_gssapi_user_message(data, conn->user,
                                                      conn->passwd,
                                                      sasl->params->service,
                                                      sasl->mutual_auth,
                                                      NULL, &conn->krb5,
                                                      &resp, &len);
    }
    else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
    if(enabledmechs & SASL_MECH_DIGEST_MD5) {
      mech = SASL_MECH_STRING_DIGEST_MD5;
      state1 = SASL_DIGESTMD5;
      sasl->authused = SASL_MECH_DIGEST_MD5;
    }
    else if(enabledmechs & SASL_MECH_CRAM_MD5) {
      mech = SASL_MECH_STRING_CRAM_MD5;
      state1 = SASL_CRAMMD5;
      sasl->authused = SASL_MECH_CRAM_MD5;
    }
    else
#endif
#ifdef USE_NTLM
    if(enabledmechs & SASL_MECH_NTLM) {
      mech = SASL_MECH_STRING_NTLM;
      state1 = SASL_NTLM;
      state2 = SASL_NTLM_TYPE2MSG;
      sasl->authused = SASL_MECH_NTLM;

      if(force_ir || data->set.sasl_ir)
        result = Curl_sasl_create_ntlm_type1_message(conn->user, conn->passwd,
                                                     &conn->ntlm, &resp, &len);
      }
    else
#endif
    if((enabledmechs & SASL_MECH_XOAUTH2) || conn->xoauth2_bearer) {
      mech = SASL_MECH_STRING_XOAUTH2;
      state1 = SASL_XOAUTH2;
      sasl->authused = SASL_MECH_XOAUTH2;

      if(force_ir || data->set.sasl_ir)
        result = sasl_create_xoauth2_message(data, conn->user,
                                             conn->xoauth2_bearer,
                                             &resp, &len);
    }
    else if(enabledmechs & SASL_MECH_LOGIN) {
      mech = SASL_MECH_STRING_LOGIN;
      state1 = SASL_LOGIN;
      state2 = SASL_LOGIN_PASSWD;
      sasl->authused = SASL_MECH_LOGIN;

      if(force_ir || data->set.sasl_ir)
        result = sasl_create_login_message(data, conn->user, &resp, &len);
    }
    else if(enabledmechs & SASL_MECH_PLAIN) {
      mech = SASL_MECH_STRING_PLAIN;
      state1 = SASL_PLAIN;
      sasl->authused = SASL_MECH_PLAIN;

      if(force_ir || data->set.sasl_ir)
        result = sasl_create_plain_message(data, conn->user, conn->passwd,
                                           &resp, &len);
    }
  }

  if(!result) {
    if(resp && sasl->params->maxirlen &&
       strlen(mech) + len > sasl->params->maxirlen) {
      free(resp);
      resp = NULL;
    }

    if(mech) {
      result = sasl->params->sendauth(conn, mech, resp);
      if(!result) {
        *progress = SASL_INPROGRESS;
        state(sasl, conn, resp? state2: state1);
      }
    }
  }

  free(resp);

  return result;
}